

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

Belief * __thiscall despot::Chain::InitialBelief(Chain *this,State *start,string *type)

{
  int iVar1;
  ostream *poVar2;
  FullChainBelief *this_00;
  
  iVar1 = std::__cxx11::string::compare((char *)type);
  if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)type), iVar1 != 0)) {
    iVar1 = std::__cxx11::string::compare((char *)type);
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Initial belief type to be supported: ",0x25);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(type->_M_dataplus)._M_p,type->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      return (Belief *)0x0;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported initial belief type: ");
    poVar2 = std::operator<<(poVar2,(string *)type);
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(0);
  }
  this_00 = (FullChainBelief *)operator_new(0x60);
  iVar1 = (**(code **)(*(long *)this + 0x28))(this);
  FullChainBelief::FullChainBelief(this_00,&this->super_DSPOMDP,5,iVar1,this->alpha_);
  return &this_00->super_Belief;
}

Assistant:

Belief* Chain::InitialBelief(const State* start, string type) const {
	Belief* belief = NULL;
	if (type == "DEFAULT" || type == "FULL") {
		belief = new FullChainBelief(this, NUM_MDP_STATES, NumActions(),
			alpha_);
	} else if (type == "SEMI") {
		// belief = new SemiChainBelief(this, NUM_MDP_STATES, NumActions(), alpha_);
		cerr << "Initial belief type to be supported: " << type << endl;
	} else {
		cerr << "Unsupported initial belief type: " << type << endl;
		exit(0);
	}
	return belief;
}